

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.h
# Opt level: O2

bool comparesEqual(QString *lhs,QByteArrayView rhs)

{
  int iVar1;
  QChar *pQVar2;
  
  pQVar2 = (QChar *)(lhs->d).ptr;
  if (pQVar2 == (QChar *)0x0) {
    pQVar2 = (QChar *)&QString::_empty;
  }
  iVar1 = QString::compare_helper(pQVar2,(lhs->d).size,rhs.m_data,rhs.m_size,CaseSensitive);
  return iVar1 == 0;
}

Assistant:

friend bool comparesEqual(const QString &lhs, QByteArrayView rhs) noexcept
    {
        return QString::compare_helper(lhs.constData(), lhs.size(),
                                       rhs.constData(), rhs.size()) == 0;
    }